

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O2

int CountNbCollisions<Blob<128>>(vector<Blob<128>,_std::allocator<Blob<128>_>_> *hashes,int nbHBits)

{
  pointer pBVar1;
  pointer pBVar2;
  bool bVar3;
  int iVar4;
  size_t hnb;
  ulong uVar5;
  int iVar6;
  Blob<128> h2;
  Blob<128> h1;
  
  pBVar1 = (hashes->super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pBVar2 = (hashes->super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar6 = 0;
  iVar4 = 0;
  for (uVar5 = 1; uVar5 < (ulong)((long)pBVar1 - (long)pBVar2 >> 4); uVar5 = uVar5 + 1) {
    Blob<128>::operator>>
              (&h1,(int)(hashes->super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>)._M_impl
                        .super__Vector_impl_data._M_start + iVar6);
    iVar6 = iVar6 + 0x10;
    Blob<128>::operator>>
              (&h2,(int)(hashes->super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>)._M_impl
                        .super__Vector_impl_data._M_start + iVar6);
    bVar3 = Blob<128>::operator==(&h1,&h2);
    iVar4 = iVar4 + (uint)bVar3;
  }
  return iVar4;
}

Assistant:

int CountNbCollisions ( std::vector<hashtype> & hashes, int nbHBits)
{
  const int origBits = sizeof(hashtype) * 8;
  const int shiftBy = origBits - nbHBits;

  assert(shiftBy > 0);

  size_t const nbH = hashes.size();
  int collcount = 0;

  for (size_t hnb = 1; hnb < nbH; hnb++)
  {
    hashtype const h1 = hashes[hnb-1] >> shiftBy;
    hashtype const h2 = hashes[hnb]   >> shiftBy;
    if(h1 == h2)
    {
      collcount++;
    }
  }

  return collcount;
}